

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileiconprovider.cpp
# Opt level: O0

QIcon __thiscall
QAbstractFileIconProviderPrivate::getIconThemeIcon
          (QAbstractFileIconProviderPrivate *this,QFileInfo *info)

{
  long lVar1;
  ulong uVar2;
  undefined8 in_RDX;
  long in_RSI;
  QIconPrivate *in_RDI;
  long in_FS_OFFSET;
  IconType in_stack_0000003c;
  QAbstractFileIconProviderPrivate *in_stack_00000040;
  QMimeType local_28 [16];
  QString *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QFileInfo::isRoot();
  if ((uVar2 & 1) == 0) {
    uVar2 = QFileInfo::isDir();
    if ((uVar2 & 1) == 0) {
      QMimeDatabase::mimeTypeForFile(local_28,in_RSI + 0x18,in_RDX,0);
      QMimeType::iconName();
      QIcon::fromTheme(in_stack_ffffffffffffffe8);
      QString::~QString((QString *)0x276216);
      QMimeType::~QMimeType(local_28);
    }
    else {
      getIconThemeIcon(in_stack_00000040,in_stack_0000003c);
    }
  }
  else {
    getIconThemeIcon(in_stack_00000040,in_stack_0000003c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QIcon)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QIcon QAbstractFileIconProviderPrivate::getIconThemeIcon(const QFileInfo &info) const
{
    if (info.isRoot())
        return getIconThemeIcon(QAbstractFileIconProvider::Drive);
    if (info.isDir())
        return getIconThemeIcon(QAbstractFileIconProvider::Folder);
#if QT_CONFIG(mimetype)
    return QIcon::fromTheme(mimeDatabase.mimeTypeForFile(info).iconName());
#else
    return QIcon::fromTheme("text-x-generic"_L1);
#endif
}